

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chunk.cpp
# Opt level: O1

void __thiscall Chunk::deserialize(Chunk *this,vector<char,_std::allocator<char>_> *data)

{
  uint uVar1;
  uint i;
  long lVar2;
  
  lVar2 = 0;
  do {
    uVar1 = *(uint *)((data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_start + lVar2 * 4);
    this->tiles_[lVar2] =
         (TileData)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18)
    ;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x400);
  *(byte *)&(this->dirtyFlags_).super__Base_bitset<1UL>._M_w =
       (byte)(this->dirtyFlags_).super__Base_bitset<1UL>._M_w | 6;
  return;
}

Assistant:

void Chunk::deserialize(const std::vector<char>& data) {
    assert(data.size() == sizeof(tiles_));
    for (unsigned int i = 0; i < WIDTH * WIDTH; ++i) {
        uint32_t tileSwapped;
        std::memcpy(&tileSwapped, data.data() + i * sizeof(TileData), sizeof(TileData));
        tileSwapped = FileStorage::byteswap(tileSwapped);
        tiles_[i] = *reinterpret_cast<TileData*>(&tileSwapped);
    }
    dirtyFlags_.set(ChunkDirtyFlag::emptyIsStale);
    dirtyFlags_.set(ChunkDirtyFlag::highlightedIsStale);
}